

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O3

bool __thiscall draco::PointCloudDecoder::DecodePointAttributesStep2(PointCloudDecoder *this)

{
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  
  puVar4 = (this->attributes_decoders_).
           super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->attributes_decoders_).
                              super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4) >> 3)) {
    lVar6 = 0;
    do {
      iVar2 = (**(code **)(*(long *)puVar4[lVar6]._M_t.
                                    super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                                    ._M_t + 0x30))();
      if (0 < iVar2) {
        iVar7 = 0;
        do {
          _Var1._M_t.
          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
               (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar6]._M_t.
               super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ._M_t;
          iVar3 = (**(code **)(*(long *)_Var1._M_t.
                                        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                        .
                                        super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                        ._M_head_impl + 0x28))
                            (_Var1._M_t.
                             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                             _M_head_impl,iVar7);
          piVar5 = (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->attribute_to_decoder_map_).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <=
              (ulong)(long)iVar3) {
            std::vector<int,_std::allocator<int>_>::resize
                      (&this->attribute_to_decoder_map_,(long)(iVar3 + 1));
            piVar5 = (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          piVar5[iVar3] = (int)lVar6;
          iVar7 = iVar7 + 1;
        } while (iVar2 != iVar7);
      }
      lVar6 = lVar6 + 1;
      puVar4 = (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(this->attributes_decoders_).
                                         super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4)
                          >> 3));
  }
  iVar2 = (*this->_vptr_PointCloudDecoder[8])(this);
  if ((char)iVar2 != '\0') {
    iVar2 = (*this->_vptr_PointCloudDecoder[9])(this);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool PointCloudDecoder::DecodePointAttributesStep2() {

  // Create map between attribute and decoder ids.
  for (int i = 0; i < num_attributes_decoders(); ++i) {
    const int32_t num_attributes = attributes_decoders_[i]->GetNumAttributes();
    for (int j = 0; j < num_attributes; ++j) {
      int att_id = attributes_decoders_[i]->GetAttributeId(j);
      if (att_id >= attribute_to_decoder_map_.size()) {
        attribute_to_decoder_map_.resize(att_id + 1);
      }
      attribute_to_decoder_map_[att_id] = i;
    }
  }

  // Decode the actual attributes using the created attribute decoders.
  if (!DecodeAllAttributes()) {
    return false;
  }

  if (!OnAttributesDecoded()) {
    return false;
  }
  return true;
}